

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject **
sweepgen(lua_State *L,global_State *g,GCObject **p,GCObject *limit,GCObject **pfirstold1)

{
  byte bVar1;
  GCObject *o;
  int marked;
  GCObject *curr;
  int white;
  GCObject **pfirstold1_local;
  GCObject *limit_local;
  GCObject **p_local;
  global_State *g_local;
  lua_State *L_local;
  
  bVar1 = g->currentwhite;
  limit_local = (GCObject *)p;
  while( true ) {
    while( true ) {
      o = limit_local->next;
      if (o == limit) {
        return &limit_local->next;
      }
      if ((o->marked & 0x18) != 0) break;
      limit_local = o;
      if ((o->marked & 7) == 0) {
        o->marked = o->marked & 0xc0 | 1 | bVar1 & 0x18;
      }
      else {
        o->marked = o->marked & 0xf8 | "\x01\x03\x03\x04\x04\x05\x06"[(int)(o->marked & 7)];
        if (((o->marked & 7) == 3) && (*pfirstold1 == (GCObject *)0x0)) {
          *pfirstold1 = o;
        }
      }
    }
    if ((1 < (o->marked & 7)) || ((o->marked & (g->currentwhite ^ 0x18)) == 0)) break;
    limit_local->next = o->next;
    freeobj(L,o);
  }
  __assert_fail("!(((curr)->marked & 7) > 1) && (((curr)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x4c4,
                "GCObject **sweepgen(lua_State *, global_State *, GCObject **, GCObject *, GCObject **)"
               );
}

Assistant:

static GCObject **sweepgen (lua_State *L, global_State *g, GCObject **p,
                            GCObject *limit, GCObject **pfirstold1) {
  static const lu_byte nextage[] = {
    G_SURVIVAL,  /* from G_NEW */
    G_OLD1,      /* from G_SURVIVAL */
    G_OLD1,      /* from G_OLD0 */
    G_OLD,       /* from G_OLD1 */
    G_OLD,       /* from G_OLD (do not change) */
    G_TOUCHED1,  /* from G_TOUCHED1 (do not change) */
    G_TOUCHED2   /* from G_TOUCHED2 (do not change) */
  };
  int white = luaC_white(g);
  GCObject *curr;
  while ((curr = *p) != limit) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(!isold(curr) && isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* correct mark and age */
      if (getage(curr) == G_NEW) {  /* new objects go back to white */
        int marked = curr->marked & ~maskgcbits;  /* erase GC bits */
        curr->marked = cast_byte(marked | G_SURVIVAL | white);
      }
      else {  /* all other objects will be old, and so keep their color */
        setage(curr, nextage[getage(curr)]);
        if (getage(curr) == G_OLD1 && *pfirstold1 == NULL)
          *pfirstold1 = curr;  /* first OLD1 object in the list */
      }
      p = &curr->next;  /* go to next element */
    }
  }
  return p;
}